

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  Module *out_module;
  Stream **ppSVar1;
  ScriptModuleType SVar2;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  WastParseOptions *pWVar3;
  undefined8 uVar4;
  undefined1 uVar14;
  Command *pCVar5;
  undefined4 uVar15;
  _func_int **pp_Var16;
  ScriptModuleType SVar17;
  undefined4 uVar18;
  Command *pCVar19;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> _Var20;
  pointer pEVar21;
  Result RVar22;
  Result RVar23;
  Index IVar24;
  pointer pEVar25;
  long lVar26;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> command;
  unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> script_module;
  ReadBinaryOptions options;
  Errors errors;
  Command *local_b0;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> local_a0;
  Command *local_98;
  CommandPtr *local_90;
  ReadBinaryOptions local_88;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  Errors local_48;
  undefined5 uVar7;
  undefined4 uVar9;
  undefined3 uVar11;
  undefined2 uVar13;
  
  pCVar19 = local_b0;
  local_a0._M_head_impl = (ScriptModule *)0x0;
  RVar22 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                   *)&local_a0);
  RVar23.enum_ = Error;
  if (RVar22.enum_ != Error) {
    MakeUnique<wabt::ModuleCommand>();
    _Var20._M_head_impl = local_a0._M_head_impl;
    SVar2 = (local_a0._M_head_impl)->type_;
    if (SVar2 == Quoted) {
      ppSVar1 = &local_88.log_stream;
      local_88.features._0_4_ = SUB84(ppSVar1,0);
      local_88.features.simd_enabled_ = SUB81((ulong)ppSVar1 >> 0x20,0);
      local_88.features.threads_enabled_ = SUB81((ulong)ppSVar1 >> 0x28,0);
      local_88.features.multi_value_enabled_ = SUB81((ulong)ppSVar1 >> 0x30,0);
      local_88.features.tail_call_enabled_ = SUB81((ulong)ppSVar1 >> 0x38,0);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"a binary module","");
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"a text module","");
      local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 &local_88,&local_48);
      lVar26 = 0;
      RVar23 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_48,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      do {
        if (local_58 + lVar26 != *(undefined1 **)((long)local_68 + lVar26)) {
          operator_delete(*(undefined1 **)((long)local_68 + lVar26));
        }
        lVar26 = lVar26 + -0x20;
      } while (lVar26 != -0x40);
    }
    else {
      out_module = (Module *)(local_b0 + 1);
      if (SVar2 == Binary) {
        local_88.log_stream = (Stream *)0x0;
        local_88._24_3_ = 0x10100;
        pWVar3 = this->options_;
        uVar4._0_1_ = (pWVar3->features).exceptions_enabled_;
        uVar4._1_1_ = (pWVar3->features).mutable_globals_enabled_;
        uVar4._2_1_ = (pWVar3->features).sat_float_to_int_enabled_;
        uVar4._3_1_ = (pWVar3->features).sign_extension_enabled_;
        uVar4._4_1_ = (pWVar3->features).simd_enabled_;
        uVar4._5_1_ = (pWVar3->features).threads_enabled_;
        uVar4._6_1_ = (pWVar3->features).multi_value_enabled_;
        uVar4._7_1_ = (pWVar3->features).tail_call_enabled_;
        uVar6 = (pWVar3->features).bulk_memory_enabled_;
        uVar8 = (pWVar3->features).reference_types_enabled_;
        uVar10 = (pWVar3->features).annotations_enabled_;
        uVar12 = (pWVar3->features).gc_enabled_;
        uVar14 = (pWVar3->features).memory64_enabled_;
        uVar13 = CONCAT11(uVar14,uVar12);
        uVar11 = CONCAT21(uVar13,uVar10);
        uVar9 = CONCAT31(uVar11,uVar8);
        uVar7 = CONCAT41(uVar9,uVar6);
        local_88._13_3_ = local_88._13_3_;
        local_88.features.memory64_enabled_ = (bool)uVar14;
        local_88.features._0_4_ = SUB84(uVar4,0);
        local_88.features._8_3_ = SUB53(uVar7,0);
        local_88.features.tail_call_enabled_ = (bool)uVar4._7_1_;
        local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_90 = out_command;
        local_88.features.simd_enabled_ = (bool)uVar4._4_1_;
        local_88.features.threads_enabled_ = (bool)uVar4._5_1_;
        local_88.features.multi_value_enabled_ = (bool)uVar4._6_1_;
        local_88.features.gc_enabled_ = (bool)uVar12;
        ReadBinaryIr("<text>",local_a0._M_head_impl[5]._vptr_ScriptModule,
                     *(long *)&local_a0._M_head_impl[5].type_ -
                     (long)local_a0._M_head_impl[5]._vptr_ScriptModule,&local_88,&local_48,
                     out_module);
        local_98 = local_b0;
        std::__cxx11::string::_M_assign((string *)(local_b0 + 3));
        pEVar21 = local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pp_Var16 = _Var20._M_head_impl[1]._vptr_ScriptModule;
        SVar17 = _Var20._M_head_impl[1].type_;
        uVar18 = *(undefined4 *)&_Var20._M_head_impl[1].field_0xc;
        SVar2 = _Var20._M_head_impl[2].type_;
        uVar15 = *(undefined4 *)&_Var20._M_head_impl[2].field_0xc;
        local_b0[2]._vptr_Command = _Var20._M_head_impl[2]._vptr_ScriptModule;
        local_b0[2].type = SVar2;
        *(undefined4 *)&local_b0[2].field_0xc = uVar15;
        (out_module->loc).filename.data_ = (char *)pp_Var16;
        local_b0[1].type = SVar17;
        *(undefined4 *)&local_b0[1].field_0xc = uVar18;
        for (pEVar25 = local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                       _M_impl.super__Vector_impl_data._M_start; pEVar25 != pEVar21;
            pEVar25 = pEVar25 + 1) {
          if (pEVar25->error_level != Error) {
            __assert_fail("error.error_level == ErrorLevel::Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wast-parser.cc"
                          ,0xb63,
                          "Result wabt::WastParser::ParseModuleCommand(Script *, CommandPtr *)");
          }
          if ((pEVar25->loc).field_1.field_1.offset == 0xffffffffffffffff) {
            Error(this,0x1a0152,(pEVar25->message)._M_dataplus._M_p);
          }
          else {
            Error(this,0x1a016d,(char *)(pEVar25->loc).field_1.field_1.offset,
                  (pEVar25->message)._M_dataplus._M_p);
          }
        }
        std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_48);
        out_command = local_90;
      }
      else {
        local_98 = local_b0;
        if (SVar2 == Text) {
          Module::operator=(out_module,(Module *)(local_a0._M_head_impl + 1));
        }
      }
      if (script != (Script *)0x0) {
        IVar24 = (Index)((ulong)((long)(script->commands).
                                       super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(script->commands).
                                      super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
        if (*(long *)&local_98[3].type != 0) {
          local_88.features._0_4_ = *(undefined4 *)&(out_module->loc).filename.data_;
          uVar15 = *(undefined4 *)((long)&local_b0[1]._vptr_Command + 4);
          local_88.features.memory64_enabled_ = (bool)local_b0[1].field_0xc;
          local_88._13_3_ = *(undefined3 *)&local_b0[1].field_0xd;
          local_88.log_stream = (Stream *)local_b0[2]._vptr_Command;
          local_88._24_4_ = local_b0[2].type;
          local_88._28_4_ = *(undefined4 *)&local_b0[2].field_0xc;
          local_88.features.simd_enabled_ = SUB41(uVar15,0);
          local_88.features.threads_enabled_ = SUB41((uint)uVar15 >> 8,0);
          local_88.features.multi_value_enabled_ = SUB41((uint)uVar15 >> 0x10,0);
          local_88.features._8_3_ = SUB43(local_b0[1].type,0);
          local_88.features.tail_call_enabled_ = SUB41((uint)uVar15 >> 0x18,0);
          local_88.features.gc_enabled_ = SUB41(local_b0[1].type >> 0x18,0);
          local_68[0] = (undefined1 *)CONCAT44(local_68[0]._4_4_,IVar24);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
          ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                      *)&script->module_bindings,0,local_98 + 3);
        }
        this->last_module_index_ = IVar24;
      }
      local_b0 = (Command *)0x0;
      pCVar5 = (out_command->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
      super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar19;
      RVar23.enum_ = Ok;
      if (pCVar5 != (Command *)0x0) {
        (*pCVar5->_vptr_Command[1])();
        RVar23.enum_ = Ok;
      }
    }
    if (local_b0 != (Command *)0x0) {
      (*local_b0->_vptr_Command[1])();
    }
  }
  if (local_a0._M_head_impl != (ScriptModule *)0x0) {
    (*(local_a0._M_head_impl)->_vptr_ScriptModule[1])();
  }
  return (Result)RVar23.enum_;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  auto command = MakeUnique<ModuleCommand>();
  Module& module = command->module;

  switch (script_module->type()) {
    case ScriptModuleType::Text:
      module = std::move(cast<TextScriptModule>(script_module.get())->module);
      break;

    case ScriptModuleType::Binary: {
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
#if WABT_TRACING
      auto log_stream = FileStream::CreateStdout();
      options.log_stream = log_stream.get();
#endif
      options.features = options_->features;
      Errors errors;
      const char* filename = "<text>";
      ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                   &errors, &module);
      module.name = bsm->name;
      module.loc = bsm->loc;
      for (const auto& error: errors) {
        assert(error.error_level == ErrorLevel::Error);
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }
      break;
    }

    case ScriptModuleType::Quoted:
      return ErrorExpected({"a binary module", "a text module"});
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module.name.empty()) {
      script->module_bindings.emplace(module.name,
                                      Binding(module.loc, command_index));
    }

    last_module_index_ = command_index;
  }

  *out_command = std::move(command);
  return Result::Ok;
}